

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  ulong *puVar1;
  cpp_dec_float<200U,_int,_void> *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined4 in_stack_fffffffffffffd08;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd10;
  double in_stack_fffffffffffffd18;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd20;
  undefined1 local_268 [128];
  ulong local_1e8;
  undefined1 local_1e0 [128];
  undefined1 local_160 [128];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  ulong *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined8 local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_e0 = in_RCX;
  local_d8 = in_RDX;
  if (in_ESI == -6) {
LAB_006bd4c2:
    local_b8 = infinity();
    local_b0 = local_160;
    local_c0 = 0;
    local_8 = local_b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_28 = local_d8;
    local_30 = local_160;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffd10,
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffd08));
    puVar1 = (ulong *)infinity();
    local_1e8 = *puVar1 ^ 0x8000000000000000;
    local_98 = local_1e0;
    local_a0 = &local_1e8;
    local_a8 = 0;
    local_10 = local_a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_38 = local_e0;
    local_40 = local_1e0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffd10,
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffd08));
  }
  else {
    if (in_ESI == -4) {
LAB_006bd699:
      puVar1 = (ulong *)infinity();
      this_00 = (cpp_dec_float<200U,_int,_void> *)(*puVar1 ^ 0x8000000000000000);
      local_68 = &stack0xfffffffffffffd18;
      local_70 = &stack0xfffffffffffffd10;
      local_78 = 0;
      local_20 = local_70;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,this_00);
      local_58 = local_e0;
      local_60 = &stack0xfffffffffffffd18;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (this_00,(cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffd08));
      return;
    }
    if (in_ESI != -2) {
      if (in_ESI == 1) goto LAB_006bd4c2;
      if (in_ESI == 2) goto LAB_006bd699;
      if (in_ESI != 4) {
        return;
      }
    }
    local_88 = infinity();
    local_80 = local_268;
    local_90 = 0;
    local_18 = local_88;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_48 = local_d8;
    local_50 = local_268;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffd10,
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffd08));
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}